

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_12cdb4e::ExternalPartitionTestDfsAPI_EncodeMatch_Test::TestBody
          (ExternalPartitionTestDfsAPI_EncodeMatch_Test *this)

{
  uint uVar1;
  undefined8 *puVar2;
  bool bVar3;
  pointer *__ptr;
  SEARCH_METHODS *message;
  double rhs_value;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Y4mVideoSource video;
  AssertHelper local_128;
  undefined1 local_120 [16];
  long local_110 [2];
  AssertHelper local_100;
  double local_f8;
  Y4mVideoSource local_f0;
  
  local_120._0_8_ = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"paris_352_288_30.y4m","");
  libaom_test::Y4mVideoSource::Y4mVideoSource(&local_f0,(string *)local_120,0,8);
  if ((long *)local_120._0_8_ != local_110) {
    operator_delete((void *)local_120._0_8_);
  }
  (this->super_ExternalPartitionTestDfsAPI).use_external_partition_ = false;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_120);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*(this->super_ExternalPartitionTestDfsAPI).super_EncoderTest._vptr_EncoderTest[2])
                (&(this->super_ExternalPartitionTestDfsAPI).super_EncoderTest,&local_f0);
    }
    bVar3 = local_120[8];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_120);
    if (bVar3 != false) goto LAB_005d46b8;
    uVar1 = (this->super_ExternalPartitionTestDfsAPI).nframes_;
    local_f8 = 0.0;
    if (uVar1 != 0) {
      local_f8 = (this->super_ExternalPartitionTestDfsAPI).psnr_ / (double)uVar1;
    }
    (this->super_ExternalPartitionTestDfsAPI).use_external_partition_ = true;
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_120);
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        (*(this->super_ExternalPartitionTestDfsAPI).super_EncoderTest._vptr_EncoderTest[2])
                  (&(this->super_ExternalPartitionTestDfsAPI).super_EncoderTest,&local_f0);
      }
      bVar3 = local_120[8];
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_120);
      if (bVar3 == false) {
        uVar1 = (this->super_ExternalPartitionTestDfsAPI).nframes_;
        rhs_value = 0.0;
        if (uVar1 != 0) {
          rhs_value = (this->super_ExternalPartitionTestDfsAPI).psnr_ / (double)uVar1;
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_120,"psnr","psnr2",local_f8,rhs_value);
        if (local_120[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_128);
          if ((undefined8 *)CONCAT71(local_120._9_7_,local_120[8]) == (undefined8 *)0x0) {
            message = "";
          }
          else {
            message = *(SEARCH_METHODS **)CONCAT71(local_120._9_7_,local_120[8]);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
                     ,0x28e,(char *)message);
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          if (local_128.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_128.data_ + 8))();
          }
        }
        puVar2 = (undefined8 *)CONCAT71(local_120._9_7_,local_120[8]);
        if (puVar2 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar2 != puVar2 + 2) {
            operator_delete((undefined8 *)*puVar2);
          }
          operator_delete(puVar2);
        }
        goto LAB_005d4707;
      }
    }
    testing::Message::Message((Message *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
               ,0x28b,
               "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_120);
  }
  else {
LAB_005d46b8:
    testing::Message::Message((Message *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
               ,0x287,
               "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_128,(Message *)local_120);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_128);
  if ((long *)local_120._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_120._0_8_ + 8))();
  }
LAB_005d4707:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(&local_f0);
  return;
}

Assistant:

TEST_P(ExternalPartitionTestDfsAPI, EncodeMatch) {
  ::libaom_test::Y4mVideoSource video("paris_352_288_30.y4m", 0, kFrameNum);
  SetExternalPartition(false);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr = GetAveragePsnr();

  SetExternalPartition(true);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr2 = GetAveragePsnr();

  EXPECT_DOUBLE_EQ(psnr, psnr2);
}